

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O0

void __thiscall
message_test_should_compare_version_Test::TestBody(message_test_should_compare_version_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  message_test_should_compare_version_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  local_21 = Fixpp::v42::Version::equals("FIX.4.2",7);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_20,(AssertionResult *)"v42::equals(\"FIX.4.2\", 7)",
               "false","true",in_R9);
    message = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        (&local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
               ,0x12,message);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(message_test, should_compare_version)
{
    using v42 = Fixpp::v42::Version;
    ASSERT_TRUE(v42::equals("FIX.4.2", 7));
}